

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

bool density_tests::detail::
     PutString<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  int32_t iVar1;
  allocator local_39;
  string local_38 [8];
  string str;
  EasyRandom *i_rand_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *queue_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"hello world!",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  iVar1 = EasyRandom::get_bool(i_rand);
  if (iVar1 == 0) {
    density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>::
    reentrant_push<std::__cxx11::string&>
              ((heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
                *)queue,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
  }
  else {
    density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>::
    push<std::__cxx11::string&>
              ((heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
                *)queue,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
  }
  std::__cxx11::string::~string(local_38);
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                std::string str("hello world!");
                if (i_rand.get_bool())
                    queue.push(str);
                else
                    queue.reentrant_push(str);
                return true;
            }